

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O0

void __thiscall
OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>::~SimpleTypeData
          (SimpleTypeData<OpenMD::FluctuatingAtypeParameters> *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__SimpleTypeData_00485650;
  FluctuatingAtypeParameters::~FluctuatingAtypeParameters((FluctuatingAtypeParameters *)0x30522a);
  GenericData::~GenericData((GenericData *)0x305234);
  return;
}

Assistant:

SimpleTypeData(const std::string& id) :
        GenericData(id), data_(ElemDataType()) {}